

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  uchar *puVar2;
  bool bVar3;
  float fVar4;
  stbtt_uint32 sVar5;
  long lVar6;
  int iVar7;
  undefined1 uVar8;
  uint uVar9;
  uint uVar11;
  int iVar10;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float dy2;
  float fVar30;
  float fVar31;
  float fVar32;
  stbtt__buf b;
  stbtt__buf sVar33;
  stbtt__buf sVar34;
  stbtt__buf sVar35;
  float in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  undefined4 uVar36;
  uint uStack_230;
  int iStack_22c;
  float in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  int iVar37;
  ulong local_208;
  float afStack_1e8 [3];
  int local_1dc;
  float s [48];
  stbtt__buf subr_stack [10];
  
  sVar34 = info->subrs;
  sVar33 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar24 = sVar33._8_8_;
  uVar36 = sVar33.data._0_4_;
  iVar21 = sVar33.data._4_4_;
  iStack_22c = sVar33.size;
  if (iStack_22c <= sVar33.cursor) {
switchD_001352bd_default:
    return 0;
  }
  bVar3 = true;
  iVar7 = 0;
  local_208 = 0;
  iVar37 = 0;
  uVar13 = 0;
  local_1dc = glyph_index;
LAB_00134f18:
  fVar26 = s[0xb];
  fVar25 = s[10];
  dy2 = s[9];
  fVar4 = s[7];
  fVar30 = s[3];
  fVar32 = s[2];
  fVar31 = s[1];
  uVar9 = (uint)uVar24;
  uStack_230 = uVar9 + 1;
  bVar1 = *(byte *)(CONCAT44(iVar21,uVar36) + (long)(int)uVar9);
  uVar12 = (uint)uVar13;
  iVar15 = (int)local_208;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    iVar7 = iVar7 + ((int)((int)(uVar13 >> 0x1f) + uVar12) >> 1);
    goto LAB_00135b52;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_00134f49_caseD_2:
    if (bVar1 < 0x20) {
      return 0;
    }
    if (bVar1 == 0xff) goto LAB_00135050;
  case 0x1c:
    if (((int)uStack_230 < 1) || (iStack_22c < (int)uVar9)) {
LAB_00135b8c:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_truetype.h"
                    ,0x478,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    sVar5 = stbtt__cff_int((stbtt__buf *)&stack0xfffffffffffffdc8);
    fVar25 = (float)(int)(short)sVar5;
    uStack_230 = uVar9;
LAB_00135090:
    if (0x2f < (int)uVar12) {
      return 0;
    }
    s[(int)uVar12] = fVar25;
    uVar14 = (ulong)(uVar12 + 1);
    break;
  case 4:
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar25 = s[uVar12 - 1];
    fVar26 = 0.0;
    goto LAB_00135577;
  case 5:
    if ((int)uVar12 < 2) {
      return 0;
    }
    uVar24 = 1;
    do {
      fVar25 = s[uVar24];
      fVar26 = s[uVar24 - 1] + c->x;
      c->x = fVar26;
      fVar25 = fVar25 + c->y;
      c->y = fVar25;
      uVar14 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar26,(int)fVar25,0,0,0,0);
      uVar24 = uVar24 + 2;
    } while (uVar24 < uVar13);
    break;
  case 6:
    iVar15 = 0;
    if ((int)uVar12 < 1) {
      return 0;
    }
    for (; iVar15 < (int)uVar12; iVar15 = iVar15 + 1) {
      fVar25 = s[iVar15] + c->x;
      c->x = fVar25;
      fVar26 = c->y + 0.0;
      c->y = fVar26;
      stbtt__csctx_v(c,'\x02',(int)fVar25,(int)fVar26,0,0,0,0);
      iVar15 = iVar15 + 1;
LAB_00135afd:
      if ((int)uVar12 <= iVar15) break;
      fVar25 = s[iVar15];
      fVar26 = c->x + 0.0;
      c->x = fVar26;
      fVar25 = fVar25 + c->y;
      c->y = fVar25;
      stbtt__csctx_v(c,'\x02',(int)fVar26,(int)fVar25,0,0,0,0);
    }
    goto LAB_00135b52;
  case 7:
    iVar15 = 0;
    if (0 < (int)uVar12) goto LAB_00135afd;
    return 0;
  case 8:
    if ((int)uVar12 < 6) {
      return 0;
    }
    uVar24 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,afStack_1e8[uVar24 - 1],afStack_1e8[uVar24],afStack_1e8[uVar24 + 1],
                 afStack_1e8[uVar24 + 2],s[uVar24 - 1],s[uVar24]);
      uVar24 = uVar24 + 6;
    } while (uVar24 < uVar13);
    goto LAB_00135b52;
  case 10:
    iVar10 = 1;
    if (iVar37 == 0) {
      uVar9 = (info->fdselect).size;
      if (uVar9 != 0) {
        if ((int)uVar9 < 0) goto LAB_00135b8c;
        puVar2 = (info->fdselect).data;
        if (*puVar2 == '\0') {
          uVar16 = (uint)((long)glyph_index + 1);
          if (uVar9 < uVar16) goto LAB_00135b8c;
          uVar11 = 0;
          if ((int)uVar16 < (int)uVar9) {
            uVar11 = (uint)puVar2[(long)glyph_index + 1];
          }
        }
        else {
          if (*puVar2 == '\x03') {
            uVar16 = 0;
            iVar17 = 1;
            iVar10 = 2;
            do {
              if (iVar17 < (int)uVar9) {
                lVar19 = (long)iVar17;
                iVar17 = iVar17 + 1;
                uVar11 = (uint)puVar2[lVar19];
              }
              else {
                uVar11 = 0;
              }
              uVar16 = uVar16 << 8 | uVar11;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
            uVar18 = 0;
            iVar10 = 2;
            do {
              if (iVar17 < (int)uVar9) {
                lVar19 = (long)iVar17;
                iVar17 = iVar17 + 1;
                uVar11 = (uint)puVar2[lVar19];
              }
              else {
                uVar11 = 0;
              }
              uVar18 = uVar18 << 8 | uVar11;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
            if (0 < (int)uVar16) {
              uVar20 = 0;
              do {
                if (iVar17 < (int)uVar9) {
                  lVar19 = (long)iVar17;
                  iVar17 = iVar17 + 1;
                  uVar11 = (uint)puVar2[lVar19];
                }
                else {
                  uVar11 = 0;
                }
                uVar22 = 0;
                iVar10 = 2;
                do {
                  if (iVar17 < (int)uVar9) {
                    lVar19 = (long)iVar17;
                    iVar17 = iVar17 + 1;
                    uVar23 = (uint)puVar2[lVar19];
                  }
                  else {
                    uVar23 = 0;
                  }
                  uVar22 = uVar22 << 8 | uVar23;
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
                if (local_1dc < (int)uVar22 && (int)uVar18 <= local_1dc) goto LAB_001358b4;
                uVar20 = uVar20 + 1;
                uVar18 = uVar22;
              } while (uVar20 != uVar16);
            }
          }
          uVar11 = 0xffffffff;
        }
LAB_001358b4:
        stbtt__cff_index_get(info->fontdicts,uVar11);
        sVar34.data._4_4_ = in_stack_fffffffffffffdc4;
        sVar34.data._0_4_ = in_stack_fffffffffffffdc0;
        sVar34.cursor = uVar36;
        sVar34.size = iVar21;
        sVar33.data._4_4_ = in_stack_fffffffffffffdec;
        sVar33.data._0_4_ = in_stack_fffffffffffffde8;
        sVar33.cursor = in_stack_fffffffffffffdf0;
        sVar33.size = iVar37;
        sVar34 = stbtt__get_subrs(sVar34,sVar33);
        iVar10 = 1;
      }
    }
    goto LAB_001358f0;
  case 0xb:
    if (iVar15 < 1) {
      return 0;
    }
    local_208 = (ulong)(iVar15 - 1);
    uVar36 = *(undefined4 *)&subr_stack[local_208].data;
    iVar21 = *(int *)((long)&subr_stack[local_208].data + 4);
    uStack_230 = subr_stack[local_208].cursor;
    iStack_22c = subr_stack[local_208].size;
    uVar14 = uVar13;
    break;
  case 0xc:
    lVar19 = (long)(int)uStack_230;
    uVar8 = 0;
    if ((int)uStack_230 < iStack_22c) {
      uStack_230 = uVar9 + 2;
      uVar8 = *(undefined1 *)(CONCAT44(iVar21,uVar36) + lVar19);
    }
    fVar29 = s[8];
    fVar28 = s[7];
    fVar27 = s[6];
    switch(uVar8) {
    case 0x22:
      if ((int)uVar12 < 7) {
        return 0;
      }
      fVar29 = s[5];
      fVar27 = s[4];
      fVar25 = s[6];
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar32;
      fVar28 = 0.0;
      fVar26 = 0.0;
      in_stack_fffffffffffffdc0 = fVar29;
      in_stack_fffffffffffffdc4 = fVar27;
      in_stack_fffffffffffffde8 = fVar25;
      break;
    case 0x23:
      if ((int)uVar12 < 0xd) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      in_stack_fffffffffffffdc0 = fVar29;
      in_stack_fffffffffffffdc4 = fVar28;
      in_stack_fffffffffffffde8 = fVar27;
      break;
    case 0x24:
      if ((int)uVar12 < 9) {
        return 0;
      }
      fVar25 = s[8];
      fVar29 = s[6];
      fVar27 = s[5];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar26 = -(fVar31 + fVar30 + fVar4);
      fVar28 = 0.0;
      dy2 = fVar4;
      in_stack_fffffffffffffdc0 = fVar25;
      in_stack_fffffffffffffdc4 = fVar29;
      in_stack_fffffffffffffde8 = fVar27;
      break;
    case 0x25:
      if ((int)uVar12 < 0xb) {
        return 0;
      }
      fVar25 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar32 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar31 = ABS(fVar25);
      fVar30 = ABS(fVar32);
      fVar26 = s[10];
      if (fVar30 < fVar31) {
        fVar26 = -fVar32;
      }
      uVar9 = -(uint)(fVar30 < fVar31);
      fVar25 = (float)(~uVar9 & (uint)-fVar25 | (uint)s[10] & uVar9);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      in_stack_fffffffffffffdc0 = fVar29;
      in_stack_fffffffffffffdc4 = fVar28;
      in_stack_fffffffffffffde8 = fVar27;
      break;
    default:
      goto switchD_001352bd_default;
    }
    goto LAB_00135266;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar3) {
      iVar7 = iVar7 + ((int)((int)(uVar13 >> 0x1f) + uVar12) >> 1);
    }
    iVar15 = iVar7 + 0xe;
    if (-1 < iVar7 + 7) {
      iVar15 = iVar7 + 7;
    }
    uStack_230 = (iVar15 >> 3) + uStack_230;
    if (((int)uStack_230 < 0) || (iStack_22c < (int)uStack_230)) goto LAB_00135b8c;
    goto LAB_001355af;
  case 0x15:
    if ((int)uVar12 < 2) {
      return 0;
    }
    fVar26 = s[uVar12 - 2];
    fVar25 = s[uVar12 - 1];
    goto LAB_00135577;
  case 0x16:
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar26 = s[uVar12 - 1];
    fVar25 = 0.0;
LAB_00135577:
    stbtt__csctx_rmove_to(c,fVar26,fVar25);
LAB_001355af:
    bVar3 = false;
    uVar14 = 0;
    break;
  case 0x18:
    if ((int)uVar12 < 8) {
      return 0;
    }
    lVar19 = -6;
    do {
      lVar6 = lVar19;
      stbtt__csctx_rccurve_to
                (c,s[lVar6 + 6],s[lVar6 + 7],s[lVar6 + 8],s[lVar6 + 9],s[lVar6 + 10],s[lVar6 + 0xb])
      ;
      lVar19 = lVar6 + 6;
    } while (lVar6 + 6 < (long)(int)uVar12 + -0xd);
    if ((int)uVar12 <= (int)lVar6 + 0xd) {
      return 0;
    }
    fVar25 = s[lVar6 + 0xd];
    fVar26 = s[lVar6 + 0xc] + c->x;
    c->x = fVar26;
    fVar25 = fVar25 + c->y;
    c->y = fVar25;
    stbtt__csctx_v(c,'\x02',(int)fVar26,(int)fVar25,0,0,0,0);
    uVar14 = 0;
    break;
  case 0x19:
    if ((int)uVar12 < 8) {
      return 0;
    }
    in_stack_fffffffffffffde8 = SUB84(info,0);
    in_stack_fffffffffffffdec = (undefined4)((ulong)info >> 0x20);
    lVar19 = 5;
    do {
      lVar6 = lVar19;
      fVar25 = afStack_1e8[lVar6];
      fVar26 = afStack_1e8[lVar6 + -1] + c->x;
      c->x = fVar26;
      fVar25 = fVar25 + c->y;
      c->y = fVar25;
      stbtt__csctx_v(c,'\x02',(int)fVar26,(int)fVar25,0,0,0,0);
      lVar19 = lVar6 + 2;
    } while (lVar6 + -2 < (long)(int)(uVar12 - 6));
    info = (stbtt_fontinfo *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    if ((int)uVar12 <= (int)lVar19) {
      return 0;
    }
    fVar27 = afStack_1e8[lVar6 + 1];
    fVar28 = afStack_1e8[lVar19];
    fVar29 = afStack_1e8[lVar6 + 3];
    fVar25 = s[lVar6 + 1];
    fVar26 = s[lVar19];
    dy2 = afStack_1e8[lVar6 + 4];
LAB_00135266:
    stbtt__csctx_rccurve_to(c,fVar27,fVar28,fVar29,dy2,fVar25,fVar26);
    goto LAB_00135b52;
  case 0x1a:
  case 0x1b:
    if ((int)uVar12 < 4) {
      return 0;
    }
    uVar24 = (ulong)(uVar12 & 1);
    if ((int)((uVar12 & 1) + 3) < (int)uVar12) {
      fVar25 = 0.0;
      if ((uVar13 & 1) != 0) {
        fVar25 = s[0];
      }
      do {
        iVar15 = (int)uVar24;
        fVar26 = s[uVar24];
        fVar31 = s[iVar15 + 3];
        if (bVar1 == 0x1b) {
          fVar32 = fVar26;
          fVar26 = fVar25;
          fVar30 = fVar31;
          fVar31 = 0.0;
        }
        else {
          fVar30 = 0.0;
          fVar32 = fVar25;
        }
        stbtt__csctx_rccurve_to(c,fVar32,fVar26,s[uVar24 + 1],s[uVar24 + 2],fVar30,fVar31);
        uVar24 = uVar24 + 4;
        fVar25 = 0.0;
      } while (iVar15 + 7 < (int)uVar12);
    }
    goto LAB_00135b52;
  case 0x1d:
    iVar10 = iVar37;
LAB_001358f0:
    if ((int)uVar12 < 1) {
      return 0;
    }
    if (9 < iVar15) {
      return 0;
    }
    fVar25 = s[uVar12 - 1];
    *(undefined4 *)&subr_stack[iVar15].data = uVar36;
    *(int *)((long)&subr_stack[iVar15].data + 4) = iVar21;
    subr_stack[iVar15].cursor = uStack_230;
    subr_stack[iVar15].size = iStack_22c;
    sVar33 = sVar34;
    if (bVar1 != 10) {
      sVar33 = info->gsubrs;
    }
    b.data = sVar33.data;
    if ((long)sVar33._8_8_ < 0) goto LAB_00135b8c;
    local_208 = (ulong)(iVar15 + 1);
    uVar16 = 0;
    iVar21 = 2;
    uVar9 = 0;
    do {
      if ((int)uVar16 < sVar33.size) {
        lVar19 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        uVar11 = (uint)b.data[lVar19];
      }
      else {
        uVar11 = 0;
      }
      uVar9 = uVar9 << 8 | uVar11;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
    uVar11 = (uint)(0x4d7 < (int)uVar9) << 10 | 0x6b;
    if (0x846b < (int)uVar9) {
      uVar11 = 0x8000;
    }
    iVar21 = uVar11 + (int)fVar25;
    sVar35 = (stbtt__buf)ZEXT816(0);
    if (iVar21 < (int)uVar9 && -1 < iVar21) {
      b._8_8_ = (ulong)uVar16 | sVar33._8_8_ & 0x7fffffff00000000;
      sVar35 = stbtt__cff_index_get(b,iVar21);
    }
    uVar36 = sVar35.data._0_4_;
    iVar21 = sVar35.data._4_4_;
    iStack_22c = sVar35.size;
    if (iStack_22c == 0) {
      return 0;
    }
    uStack_230 = 0;
    uVar14 = (ulong)(uVar12 - 1);
    iVar37 = iVar10;
    break;
  case 0x1e:
    iVar15 = 0;
    if ((int)uVar12 < 4) {
      return 0;
    }
    for (; iVar15 + 3 < (int)uVar12; iVar15 = iVar15 + 4) {
      fVar25 = 0.0;
      if (uVar12 - iVar15 == 5) {
        fVar25 = s[(long)iVar15 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar15],s[(long)iVar15 + 1],s[(long)iVar15 + 2],s[iVar15 + 3],fVar25);
      iVar15 = iVar15 + 4;
LAB_00135a56:
      if ((int)uVar12 <= iVar15 + 3) break;
      fVar25 = 0.0;
      if (uVar12 - iVar15 == 5) {
        fVar25 = s[(long)iVar15 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar15],0.0,s[(long)iVar15 + 1],s[(long)iVar15 + 2],fVar25,s[iVar15 + 3]);
    }
LAB_00135b52:
    uVar14 = 0;
    break;
  case 0x1f:
    iVar15 = 0;
    if (3 < (int)uVar12) goto LAB_00135a56;
    return 0;
  default:
    if (bVar1 != 0xff) goto switchD_00134f49_caseD_2;
LAB_00135050:
    uVar9 = 0;
    iVar15 = 4;
    do {
      if ((int)uStack_230 < iStack_22c) {
        lVar19 = (long)(int)uStack_230;
        uStack_230 = uStack_230 + 1;
        uVar16 = (uint)*(byte *)(CONCAT44(iVar21,uVar36) + lVar19);
      }
      else {
        uVar16 = 0;
      }
      uVar9 = uVar9 << 8 | uVar16;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    fVar25 = (float)(int)uVar9 * 1.5258789e-05;
    goto LAB_00135090;
  }
  uVar24 = (ulong)uStack_230;
  uVar13 = uVar14;
  if (iStack_22c <= (int)uStack_230) {
    return 0;
  }
  goto LAB_00134f18;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}